

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

bool internalJSONNode::AreEqualNoCase(char *ch_one,char *ch_two)

{
  char cVar1;
  char cVar2;
  char c_two;
  char *pcStack_20;
  char c_one;
  char *ch_two_local;
  char *ch_one_local;
  
  pcStack_20 = ch_two;
  ch_two_local = ch_one;
  do {
    if (*ch_two_local == '\0') {
      return *pcStack_20 == '\0';
    }
    cVar1 = *ch_two_local;
    cVar2 = *pcStack_20;
    if (cVar1 != cVar2) {
      if ((cVar2 < 'A') || ('Z' < cVar2)) {
        if ((cVar2 < 'a') || ('z' < cVar2)) {
          return false;
        }
        if (cVar1 != (char)(cVar2 + -0x20)) {
          return false;
        }
      }
      else if (cVar1 != (char)(cVar2 + ' ')) {
        return false;
      }
    }
    ch_two_local = ch_two_local + 1;
    pcStack_20 = pcStack_20 + 1;
  } while( true );
}

Assistant:

bool internalJSONNode::AreEqualNoCase(const json_char * ch_one, const json_char * ch_two) json_nothrow {
	   while (*ch_one){  //only need to check one, if the other one terminates early, the check will cause it to fail
		  const json_char c_one = *ch_one;
		  const json_char c_two = *ch_two;
		  if (c_one != c_two){
			 if ((c_two > 64) && (c_two < 91)){  //A - Z
				if (c_one != (json_char)(c_two + 32)) return false;
			 } else if ((c_two > 96) && (c_two < 123)){  //a - z
				if (c_one != (json_char)(c_two - 32)) return false;
			 } else { //not a letter, so return false
				return false;
			 }
		  }
		  ++ch_one;
		  ++ch_two;

	   }
	   return *ch_two == '\0';  //this one has to be null terminated too, or else json_string two is longer, hence, not equal
    }